

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O3

void __thiscall
glu::VariableDeclaration::VariableDeclaration
          (VariableDeclaration *this,VarType *varType_,string *name_,Storage storage_,
          Interpolation interpolation_,Layout *layout_,deUint32 memoryAccessQualifierBits_)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  FormatLayout FVar4;
  
  (this->layout).matrixOrder = layout_->matrixOrder;
  iVar2 = layout_->binding;
  iVar3 = layout_->offset;
  FVar4 = layout_->format;
  (this->layout).location = layout_->location;
  (this->layout).binding = iVar2;
  (this->layout).offset = iVar3;
  (this->layout).format = FVar4;
  this->interpolation = interpolation_;
  this->storage = storage_;
  (this->varType).m_type = TYPE_LAST;
  (this->varType).m_data.array.elementType = (VarType *)0x0;
  (this->varType).m_data.array.size = 0;
  VarType::operator=(&this->varType,varType_);
  this->memoryAccessQualifierBits = memoryAccessQualifierBits_;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name_->_M_string_length);
  return;
}

Assistant:

VariableDeclaration::VariableDeclaration (const VarType& varType_, const std::string& name_, Storage storage_, Interpolation interpolation_, const Layout& layout_, deUint32 memoryAccessQualifierBits_)
	: layout						(layout_)
	, interpolation					(interpolation_)
	, storage						(storage_)
	, varType						(varType_)
	, memoryAccessQualifierBits		(memoryAccessQualifierBits_)
	, name							(name_)
{
}